

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bootstrap.hpp
# Opt level: O2

Const_Proxy_Function chaiscript::bootstrap::Bootstrap::get_guard(Const_Proxy_Function *t_pf)

{
  element_type *peVar1;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var2;
  runtime_error *this;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  Const_Proxy_Function CVar3;
  __shared_ptr<chaiscript::dispatch::Proxy_Function_Base,_(__gnu_cxx::_Lock_policy)2> local_38;
  shared_ptr<const_chaiscript::dispatch::Dynamic_Proxy_Function> pf;
  
  std::
  dynamic_pointer_cast<chaiscript::dispatch::Dynamic_Proxy_Function_const,chaiscript::dispatch::Proxy_Function_Base_const>
            ((shared_ptr<const_chaiscript::dispatch::Proxy_Function_Base> *)&pf);
  if (pf.
      super___shared_ptr<const_chaiscript::dispatch::Dynamic_Proxy_Function,_(__gnu_cxx::_Lock_policy)2>
      ._M_ptr != (element_type *)0x0) {
    Catch::clara::std::
    __shared_ptr<chaiscript::dispatch::Proxy_Function_Base,_(__gnu_cxx::_Lock_policy)2>::
    __shared_ptr(&local_38,
                 &((pf.
                    super___shared_ptr<const_chaiscript::dispatch::Dynamic_Proxy_Function,_(__gnu_cxx::_Lock_policy)2>
                   ._M_ptr)->m_guard).
                  super___shared_ptr<chaiscript::dispatch::Proxy_Function_Base,_(__gnu_cxx::_Lock_policy)2>
                );
    peVar1 = local_38._M_ptr;
    Catch::clara::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              (&local_38._M_refcount);
    if (peVar1 != (element_type *)0x0) {
      Catch::clara::std::
      __shared_ptr<chaiscript::dispatch::Proxy_Function_Base,_(__gnu_cxx::_Lock_policy)2>::
      __shared_ptr(&local_38,
                   &((pf.
                      super___shared_ptr<const_chaiscript::dispatch::Dynamic_Proxy_Function,_(__gnu_cxx::_Lock_policy)2>
                     ._M_ptr)->m_guard).
                    super___shared_ptr<chaiscript::dispatch::Proxy_Function_Base,_(__gnu_cxx::_Lock_policy)2>
                  );
      _Var2._M_pi = local_38._M_refcount._M_pi;
      local_38._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      (t_pf->
      super___shared_ptr<const_chaiscript::dispatch::Proxy_Function_Base,_(__gnu_cxx::_Lock_policy)2>
      )._M_ptr = local_38._M_ptr;
      (t_pf->
      super___shared_ptr<const_chaiscript::dispatch::Proxy_Function_Base,_(__gnu_cxx::_Lock_policy)2>
      )._M_refcount._M_pi = _Var2._M_pi;
      local_38._M_ptr = (element_type *)0x0;
      Catch::clara::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                (&local_38._M_refcount);
      Catch::clara::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                (&pf.
                  super___shared_ptr<const_chaiscript::dispatch::Dynamic_Proxy_Function,_(__gnu_cxx::_Lock_policy)2>
                  ._M_refcount);
      CVar3.
      super___shared_ptr<const_chaiscript::dispatch::Proxy_Function_Base,_(__gnu_cxx::_Lock_policy)2>
      ._M_refcount._M_pi = extraout_RDX._M_pi;
      CVar3.
      super___shared_ptr<const_chaiscript::dispatch::Proxy_Function_Base,_(__gnu_cxx::_Lock_policy)2>
      ._M_ptr = (element_type *)t_pf;
      return (Const_Proxy_Function)
             CVar3.
             super___shared_ptr<const_chaiscript::dispatch::Proxy_Function_Base,_(__gnu_cxx::_Lock_policy)2>
      ;
    }
  }
  this = (runtime_error *)__cxa_allocate_exception(0x10);
  std::runtime_error::runtime_error(this,"Function does not have a guard");
  __cxa_throw(this,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

static Const_Proxy_Function get_guard(const Const_Proxy_Function &t_pf) {
      const auto pf = std::dynamic_pointer_cast<const dispatch::Dynamic_Proxy_Function>(t_pf);
      if (pf && pf->get_guard()) {
        return pf->get_guard();
      } else {
        throw std::runtime_error("Function does not have a guard");
      }
    }